

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

void CVmBifNet::get_event(uint oargc)

{
  long *plVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  long lVar4;
  __pid_t _Var5;
  int iVar6;
  uint uVar7;
  vm_obj_id_t vVar8;
  size_t len;
  char *__s;
  void *pvVar9;
  long *plVar10;
  long *in_FS_OFFSET;
  int argc;
  TadsMessage *msg;
  int evt_code;
  err_frame_t err_cur__;
  uint local_124;
  long *local_120;
  vm_obj_id_t local_114;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  CVmBif::check_argc_range(oargc,0,1);
  if (oargc == 0) {
LAB_001ffbad:
    pvVar9 = (void *)0xffffffffffffffff;
  }
  else {
    if (sp_[-1].typ == VM_NIL) {
      sp_ = sp_ + -1;
      goto LAB_001ffbad;
    }
    iVar6 = CVmBif::pop_int_val();
    pvVar9 = (void *)(long)iVar6;
  }
  vVar8 = G_predef_X.net_event;
  local_120 = (long *)0x0;
  _Var5 = TadsMessageQueue::wait(G_net_queue_X,pvVar9);
  plVar1 = local_120;
  if (local_120 == (long *)0x0) {
    plVar10 = (long *)0x0;
  }
  else {
    iVar6 = strcmp((char *)local_120[2],"TadsEventMessage");
    plVar10 = (long *)0x0;
    if (iVar6 == 0) {
      plVar10 = plVar1;
    }
  }
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  uVar7 = G_predef_X.net_timeout_event;
  pvVar3 = sp_;
  if (local_110[0] != 0) goto LAB_001ffdd6;
  switch(_Var5) {
  case 0:
    if (plVar10 == (long *)0x0) {
      __s = "getNetEvent(): unexpected message type in queue";
      goto LAB_001ffd51;
    }
    uVar7 = (**(code **)(*plVar10 + 0x10))(plVar10,&local_124,&local_114);
    pvVar3 = sp_;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).obj = local_114;
    local_124 = local_124 + 1;
    goto LAB_001ffd85;
  case 1:
    __s = "getNetEvent(): queue terminated";
    goto LAB_001ffd51;
  case 2:
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).obj = 3;
    uVar7 = vVar8;
    break;
  case -1:
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_INT;
    (pvVar3->val).obj = 2;
    break;
  default:
    __s = "getNetEvent(): error waiting for request message";
LAB_001ffd51:
    len = strlen(__s);
    CVmRun::push_string(&G_interpreter_X,__s,len);
    CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.net_exception,1,__s);
  }
  local_124 = 1;
LAB_001ffd85:
  if (uVar7 == 0) {
    uVar7 = G_predef_X.net_event;
  }
  if (uVar7 == 0) {
    vVar8 = CVmObjList::create_from_stack((uchar **)0x0,local_124);
    CVmBif::retval_obj(vVar8);
  }
  else {
    (**(code **)(*(long *)&G_obj_table_X.pages_[uVar7 >> 0xc][uVar7 & 0xfff].ptr_ + 0x18))
              (G_obj_table_X.pages_[uVar7 >> 0xc] + (uVar7 & 0xfff),uVar7,0);
  }
LAB_001ffdd6:
  if ((-1 < (short)local_110[0]) && (local_110[0] = local_110[0] | 0x8000, local_120 != (long *)0x0)
     ) {
    LOCK();
    plVar1 = local_120 + 1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      (**(code **)(*local_120 + 8))();
    }
  }
  lVar4 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar4;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar9 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar9;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return;
}

Assistant:

void CVmBifNet::get_event(VMG_ uint oargc)
{
    /* check arguments */
    check_argc_range(vmg_ oargc, 0, 1);

    /* get the timeout, if present */
    long timeout = OS_FOREVER;
    if (oargc >= 1)
    {
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            timeout = pop_int_val(vmg0_);
    }

    /* we don't know the NetEvent subclass yet, so presume the base class */
    vm_obj_id_t ev_cl = G_predef->net_event;
    int argc;

    /* get the next message */
    TadsMessage *msg = 0;
    int wret = G_net_queue->wait(vmg_ timeout, &msg);

    /* cast the message */
    TadsEventMessage *evtmsg = cast_tads_message(TadsEventMessage, msg);

    /* make sure we release the message before exiting */
    err_try
    {
        /* check the wait result */
        const char *err;
        switch (wret)
        {
        case OSWAIT_EVENT + 0:
            /* we got a message */
            if (evtmsg != 0)
            {
                /* ask the message to set up a new NetRequestEvent */
                int evt_code;
                ev_cl = evtmsg->prep_event_obj(vmg_ &argc, &evt_code);
            
                /* add the event type argument */
                G_interpreter->push_int(vmg_ evt_code);
                ++argc;
            }
            else
            {
                /* unrecognized message type */
                err = "getNetEvent(): unexpected message type in queue";
                goto evt_error;
            }
            break;

        case OSWAIT_EVENT + 1:
            /* 'quit' event - return an error */
            err = "getNetEvent(): queue terminated";
            goto evt_error;

        case OSWAIT_EVENT + 2:
            /* debug break - return a NetEvent with the interrupt code */
            argc = 1;
            G_interpreter->push_int(vmg_ VMBN_EVT_DBGBRK);
            break;
            
        case OSWAIT_TIMEOUT:
            /* the timeout expired - return a NetTimeoutEvent */
            ev_cl = G_predef->net_timeout_event;
            argc = 1;
            G_interpreter->push_int(vmg_ VMBN_EVT_TIMEOUT);
            break;

        case OSWAIT_ERROR:
        default:
            /* the wait failed */
            err = "getNetEvent(): error waiting for request message";

        evt_error:
            /* on error, throw a NetException describing the problem */
            G_interpreter->push_string(vmg_ err);
            G_interpreter->throw_new_class(
                vmg_ G_predef->net_exception, 1, err);
            AFTER_ERR_THROW(break;)
        }
        
        /* 
         *   if the specific event type subclass isn't defined, fall back on
         *   the base NetEvent class 
         */
        if (ev_cl == VM_INVALID_OBJ)
            ev_cl = G_predef->net_event;

        /* 
         *   construct the NetEvent subclass, or a generic list if we don't
         *   even have the NetEvent class defined 
         */
        if (ev_cl != VM_INVALID_OBJ)
            vm_objp(vmg_ ev_cl)->create_instance(vmg_ ev_cl, 0, argc);
        else
            retval_obj(vmg_ CVmObjList::create_from_stack(vmg_ 0, argc));
    }